

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
__thiscall
duckdb::StandardColumnWriter<long,_long,_duckdb::ParquetCastOperator>::InitializeWriteState
          (StandardColumnWriter<long,_long,_duckdb::ParquetCastOperator> *this,RowGroup *row_group)

{
  pointer pSVar1;
  RowGroup *in_RDX;
  long in_RSI;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_> in_RDI;
  templated_unique_single_t result;
  RowGroup *in_stack_00000238;
  PrimitiveColumnWriter *in_stack_00000240;
  unique_ptr<duckdb::StandardColumnWriterState<long,_long,_duckdb::ParquetCastOperator>,_std::default_delete<duckdb::StandardColumnWriterState<long,_long,_duckdb::ParquetCastOperator>_>_>
  *in_stack_ffffffffffffff88;
  _Head_base<0UL,_duckdb::ColumnWriterState_*,_false> this_00;
  unsigned_long *args_2;
  
  args_2 = *(unsigned_long **)(in_RSI + 8);
  this_00._M_head_impl =
       (ColumnWriterState *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
       .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false>._M_head_impl;
  std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>::size
            (&(in_RDX->columns).
              super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
            );
  make_uniq<duckdb::StandardColumnWriterState<long,long,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb_parquet::RowGroup&,unsigned_long>
            ((ParquetWriter *)&stack0xffffffffffffffe0,in_RDX,args_2);
  pSVar1 = unique_ptr<duckdb::StandardColumnWriterState<long,_long,_duckdb::ParquetCastOperator>,_std::default_delete<duckdb::StandardColumnWriterState<long,_long,_duckdb::ParquetCastOperator>_>,_true>
           ::operator->((unique_ptr<duckdb::StandardColumnWriterState<long,_long,_duckdb::ParquetCastOperator>,_std::default_delete<duckdb::StandardColumnWriterState<long,_long,_duckdb::ParquetCastOperator>_>,_true>
                         *)this_00._M_head_impl);
  pSVar1->encoding = RLE_DICTIONARY;
  PrimitiveColumnWriter::RegisterToRowGroup(in_stack_00000240,in_stack_00000238);
  unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>::
  unique_ptr<duckdb::StandardColumnWriterState<long,long,duckdb::ParquetCastOperator>,std::default_delete<duckdb::StandardColumnWriterState>,void>
            ((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
              *)this_00._M_head_impl,in_stack_ffffffffffffff88);
  unique_ptr<duckdb::StandardColumnWriterState<long,_long,_duckdb::ParquetCastOperator>,_std::default_delete<duckdb::StandardColumnWriterState<long,_long,_duckdb::ParquetCastOperator>_>,_true>
  ::~unique_ptr((unique_ptr<duckdb::StandardColumnWriterState<long,_long,_duckdb::ParquetCastOperator>,_std::default_delete<duckdb::StandardColumnWriterState<long,_long,_duckdb::ParquetCastOperator>_>,_true>
                 *)0x5d0a43);
  return (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         (__uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
          )in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
           .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ColumnWriterState> InitializeWriteState(duckdb_parquet::RowGroup &row_group) override {
		auto result = make_uniq<StandardColumnWriterState<SRC, TGT, OP>>(writer, row_group, row_group.columns.size());
		result->encoding = duckdb_parquet::Encoding::RLE_DICTIONARY;
		RegisterToRowGroup(row_group);
		return std::move(result);
	}